

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

Regexp * __thiscall re2::Regexp::ParseState::FinishRegexp(ParseState *this,Regexp *re)

{
  CharClassBuilder *this_00;
  CharClass *pCVar1;
  CharClassBuilder *ccb;
  
  if (((re != (Regexp *)0x0) && (re->down_ = (Regexp *)0x0, re->op_ == '\x14')) &&
     (this_00 = (re->field_7).field_3.ccb_, this_00 != (CharClassBuilder *)0x0)) {
    (re->field_7).field_1.name_ = (string *)0x0;
    pCVar1 = CharClassBuilder::GetCharClass(this_00);
    (re->field_7).field_3.cc_ = pCVar1;
    std::
    _Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
    ::~_Rb_tree(&(this_00->ranges_)._M_t);
    operator_delete(this_00,0x40);
  }
  return re;
}

Assistant:

Regexp* Regexp::ParseState::FinishRegexp(Regexp* re) {
  if (re == NULL)
    return NULL;
  re->down_ = NULL;

  if (re->op_ == kRegexpCharClass && re->ccb_ != NULL) {
    CharClassBuilder* ccb = re->ccb_;
    re->ccb_ = NULL;
    re->cc_ = ccb->GetCharClass();
    delete ccb;
  }

  return re;
}